

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

bool CanonicalizePath(char *path,size_t *len,uint64_t *slash_bits,string *err)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  Metrics *this;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  Metric *pMVar7;
  ulong uVar8;
  char *pcVar9;
  char cVar10;
  long lVar11;
  ScopedMetric metrics_h_scoped;
  char *components [60];
  
  if (CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)::metrics_h_metric
      == '\0') {
    iVar4 = __cxa_guard_acquire(&CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)
                                 ::metrics_h_metric);
    this = g_metrics;
    if (iVar4 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar7 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)components,"canonicalize path",(allocator<char> *)&metrics_h_scoped);
        pMVar7 = Metrics::NewMetric(this,(string *)components);
        std::__cxx11::string::~string((string *)components);
      }
      CanonicalizePath::metrics_h_metric = pMVar7;
      __cxa_guard_release(&CanonicalizePath(char*,unsigned_long*,unsigned_long*,std::__cxx11::string*)
                           ::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&metrics_h_scoped,CanonicalizePath::metrics_h_metric);
  sVar3 = *len;
  if (sVar3 != 0) {
    pcVar2 = path + sVar3;
    pcVar5 = path + (*path == '/');
    uVar8 = 0;
    pcVar9 = pcVar5;
LAB_0011abca:
    do {
      if (pcVar2 <= pcVar9) goto LAB_0011ac88;
      lVar11 = 1;
      if (*pcVar9 == '/') {
LAB_0011abff:
        pcVar9 = pcVar9 + lVar11;
        goto LAB_0011abca;
      }
      iVar4 = (int)uVar8;
      if (*pcVar9 == '.') {
        pcVar6 = pcVar9 + 1;
        lVar11 = 2;
        if ((pcVar6 == pcVar2) || (*pcVar6 == '/')) goto LAB_0011abff;
        if ((*pcVar6 == '.') && ((pcVar1 = pcVar9 + 2, pcVar1 == pcVar2 || (*pcVar1 == '/')))) {
          if (iVar4 < 1) {
            *pcVar5 = '.';
            pcVar5[1] = *pcVar6;
            pcVar5[2] = *pcVar1;
            pcVar5 = pcVar5 + 3;
          }
          else {
            uVar8 = (ulong)(iVar4 - 1);
            pcVar5 = components[uVar8];
          }
          pcVar9 = pcVar9 + 3;
          goto LAB_0011abca;
        }
      }
      if (iVar4 == 0x3c) {
        Fatal("path has too many components : %s",path);
      }
      components[iVar4] = pcVar5;
      uVar8 = (ulong)(iVar4 + 1);
      pcVar6 = pcVar5;
      for (; pcVar5 = pcVar6 + 1, pcVar9 != pcVar2; pcVar9 = pcVar9 + 1) {
        if (*pcVar9 == '/') {
          cVar10 = '/';
          goto LAB_0011ac5e;
        }
        *pcVar6 = *pcVar9;
        pcVar6 = pcVar5;
      }
      cVar10 = *pcVar2;
      pcVar9 = pcVar2;
LAB_0011ac5e:
      pcVar9 = pcVar9 + 1;
      *pcVar6 = cVar10;
    } while( true );
  }
  std::__cxx11::string::assign((char *)err);
LAB_0011acb4:
  ScopedMetric::~ScopedMetric(&metrics_h_scoped);
  return sVar3 != 0;
LAB_0011ac88:
  if (pcVar5 == path) {
    pcVar5[0] = '.';
    pcVar5[1] = '\0';
    pcVar5 = pcVar5 + 2;
  }
  *len = (size_t)(pcVar5 + ~(ulong)path);
  *slash_bits = 0;
  goto LAB_0011acb4;
}

Assistant:

bool CanonicalizePath(char* path, size_t* len, uint64_t* slash_bits,
                      string* err) {
  // WARNING: this function is performance-critical; please benchmark
  // any changes you make to it.
  METRIC_RECORD("canonicalize path");
  if (*len == 0) {
    *err = "empty path";
    return false;
  }

  const int kMaxPathComponents = 60;
  char* components[kMaxPathComponents];
  int component_count = 0;

  char* start = path;
  char* dst = start;
  const char* src = start;
  const char* end = start + *len;

  if (IsPathSeparator(*src)) {
#ifdef _WIN32

    // network path starts with //
    if (*len > 1 && IsPathSeparator(*(src + 1))) {
      src += 2;
      dst += 2;
    } else {
      ++src;
      ++dst;
    }
#else
    ++src;
    ++dst;
#endif
  }

  while (src < end) {
    if (*src == '.') {
      if (src + 1 == end || IsPathSeparator(src[1])) {
        // '.' component; eliminate.
        src += 2;
        continue;
      } else if (src[1] == '.' && (src + 2 == end || IsPathSeparator(src[2]))) {
        // '..' component.  Back up if possible.
        if (component_count > 0) {
          dst = components[component_count - 1];
          src += 3;
          --component_count;
        } else {
          *dst++ = *src++;
          *dst++ = *src++;
          *dst++ = *src++;
        }
        continue;
      }
    }

    if (IsPathSeparator(*src)) {
      src++;
      continue;
    }

    if (component_count == kMaxPathComponents)
      Fatal("path has too many components : %s", path);
    components[component_count] = dst;
    ++component_count;

    while (src != end && !IsPathSeparator(*src))
      *dst++ = *src++;
    *dst++ = *src++;  // Copy '/' or final \0 character as well.
  }

  if (dst == start) {
    *dst++ = '.';
    *dst++ = '\0';
  }

  *len = dst - start - 1;
#ifdef _WIN32
  uint64_t bits = 0;
  uint64_t bits_mask = 1;

  for (char* c = start; c < start + *len; ++c) {
    switch (*c) {
      case '\\':
        bits |= bits_mask;
        *c = '/';
        NINJA_FALLTHROUGH;
      case '/':
        bits_mask <<= 1;
    }
  }

  *slash_bits = bits;
#else
  *slash_bits = 0;
#endif
  return true;
}